

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket-rpc.c++
# Opt level: O0

Promise<void> __thiscall
capnp::WebSocketMessageStream::writeMessage
          (WebSocketMessageStream *this,ArrayPtr<const_int> fds,
          ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  uchar *puVar1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  size_t sVar2;
  RefOrVoid<kj::VectorOutputStream> this_00;
  VectorOutputStream *this_01;
  ArrayPtr<const_capnp::word> *pAVar3;
  ArrayPtr<const_capnp::word> *output;
  ArrayPtr<const_capnp::word> *in_R9;
  ArrayPtr<unsigned_char> AVar4;
  ArrayPtr<const_unsigned_char> AVar5;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  undefined1 local_a0 [8];
  VectorOutputStream *local_98;
  ArrayPtr<unsigned_char> arrayPtr;
  unsigned_long local_50;
  undefined1 local_48 [8];
  Own<kj::VectorOutputStream,_std::nullptr_t> stream;
  WebSocketMessageStream *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_local;
  ArrayPtr<const_int> fds_local;
  
  output = (ArrayPtr<const_capnp::word> *)segments.size_;
  pAVar3 = segments.ptr;
  segments_00.size_ = (size_t)in_R9;
  segments_00.ptr = output;
  stream.ptr = (VectorOutputStream *)fds.ptr;
  sVar2 = computeSerializedSizeInWords(segments_00);
  local_50 = sVar2 << 3;
  kj::heap<kj::VectorOutputStream,unsigned_long>((kj *)local_48,&local_50);
  this_00 = kj::Own<kj::VectorOutputStream,_std::nullptr_t>::operator*
                      ((Own<kj::VectorOutputStream,_std::nullptr_t> *)local_48);
  segments_01.size_ = (size_t)pAVar3;
  segments_01.ptr = in_R9;
  arrayPtr.size_ = (size_t)output;
  capnp::writeMessage((capnp *)this_00,(OutputStream *)output,segments_01);
  this_01 = kj::Own<kj::VectorOutputStream,_std::nullptr_t>::operator->
                      ((Own<kj::VectorOutputStream,_std::nullptr_t> *)local_48);
  AVar4 = kj::VectorOutputStream::getArray(this_01);
  arrayPtr.ptr = (uchar *)AVar4.size_;
  local_98 = (VectorOutputStream *)AVar4.ptr;
  puVar1 = (((VectorOutputStream *)fds.ptr)->vector).ptr;
  AVar5 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_98);
  (*(code *)**(undefined8 **)puVar1)(local_a0,puVar1,AVar5.ptr,AVar5.size_);
  kj::mv<kj::Own<kj::VectorOutputStream,decltype(nullptr)>>
            ((Own<kj::VectorOutputStream,_std::nullptr_t> *)local_48);
  kj::Promise<void>::attach<kj::Own<kj::VectorOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,(Own<kj::VectorOutputStream,_std::nullptr_t> *)local_a0);
  kj::Promise<void>::~Promise((Promise<void> *)local_a0);
  kj::Own<kj::VectorOutputStream,_std::nullptr_t>::~Own
            ((Own<kj::VectorOutputStream,_std::nullptr_t> *)local_48);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> WebSocketMessageStream::writeMessage(
    kj::ArrayPtr<const int> fds,
    kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  // TODO(perf): Right now the WebSocket interface only supports send() for
  // contiguous arrays, so we need to copy the whole message into a new buffer
  // in order to send it, whereas ideally we could just write each segment
  // (and the segment table) in sequence. Perhaps we should extend the WebSocket
  // interface to be able to send an ArrayPtr<ArrayPtr<byte>> as one binary
  // message, and then use that to avoid an extra copy here.

  auto stream = kj::heap<kj::VectorOutputStream>(
      computeSerializedSizeInWords(segments) * sizeof(word));
  capnp::writeMessage(*stream, segments);
  auto arrayPtr = stream->getArray();
  return socket.send(arrayPtr).attach(kj::mv(stream));
}